

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O0

void GPU_BlitRect(GPU_Image *image,GPU_Rect *src_rect,GPU_Target *target,GPU_Rect *dest_rect)

{
  float local_30;
  float local_2c;
  float h;
  float w;
  GPU_Rect *dest_rect_local;
  GPU_Target *target_local;
  GPU_Rect *src_rect_local;
  GPU_Image *image_local;
  
  if (image != (GPU_Image *)0x0) {
    if (src_rect == (GPU_Rect *)0x0) {
      local_2c = (float)image->w;
      local_30 = (float)image->h;
    }
    else {
      local_2c = src_rect->w;
      local_30 = src_rect->h;
    }
    GPU_BlitRectX(image,src_rect,target,dest_rect,0.0,local_2c * 0.5,local_30 * 0.5,0);
  }
  return;
}

Assistant:

void GPU_BlitRect(GPU_Image* image, GPU_Rect* src_rect, GPU_Target* target, GPU_Rect* dest_rect)
{
    float w = 0.0f;
    float h = 0.0f;
    
    if(image == NULL)
        return;
    
    if(src_rect == NULL)
    {
        w = image->w;
        h = image->h;
    }
    else
    {
        w = src_rect->w;
        h = src_rect->h;
    }
    
    GPU_BlitRectX(image, src_rect, target, dest_rect, 0.0f, w*0.5f, h*0.5f, GPU_FLIP_NONE);
}